

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContinuumDruckerPrager::ArchiveOUT
          (ChContinuumDruckerPrager *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChContinuumDruckerPrager>(marchive);
  ChArchiveOut::VersionWrite<chrono::fea::ChContinuumElastoplastic>(marchive);
  ChContinuumElastic::ArchiveOUT((ChContinuumElastic *)this,marchive);
  local_30 = &this->elastic_yeld;
  local_38 = "this->elastic_yeld";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->alpha;
  local_38 = "this->alpha";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->dilatancy;
  local_38 = "this->dilatancy";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->hardening_speed;
  local_38 = "this->hardening_speed";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->hardening_limit;
  local_38 = "this->hardening_limit";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->flow_rate;
  local_38 = "this->flow_rate";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumDruckerPrager::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContinuumDruckerPrager>();
    // serialize parent class
    ChContinuumElastoplastic::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(this->elastic_yeld);
    marchive << CHNVP(this->alpha);
    marchive << CHNVP(this->dilatancy);
    marchive << CHNVP(this->hardening_speed);
    marchive << CHNVP(this->hardening_limit);
    marchive << CHNVP(this->flow_rate);
}